

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O2

void convolve_2d_sr_hor_2tap_avx2
               (uint8_t *src,int32_t src_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_q4,int16_t *im_block)

{
  undefined1 auVar1 [32];
  long lVar2;
  long lVar3;
  undefined1 (*pauVar4) [16];
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  __m256i r [2];
  __m256i local_e0;
  __m256i local_c0;
  __m256i local_a0;
  undefined1 local_80 [32];
  
  auVar12 = _DAT_004c21c0;
  auVar11 = _DAT_0046dde0;
  if (w < 9) {
    auVar6 = vpsrlw_avx(ZEXT416(*(uint *)(filter_params_x->filter_ptr +
                                         (ulong)((uint)filter_params_x->taps * (subpel_x_q4 & 0xfU))
                                         + 3)),1);
    auVar6 = vpshufb_avx(auVar6,_DAT_0046d970);
    lVar2 = (long)src_stride;
    lVar3 = (long)(src_stride * 2);
    if (w == 2) {
      lVar5 = 0;
      auVar11._8_2_ = 2;
      auVar11._0_8_ = 0x2000200020002;
      auVar11._10_2_ = 2;
      auVar11._12_2_ = 2;
      auVar11._14_2_ = 2;
      do {
        auVar12 = vpinsrd_avx(ZEXT416(*(uint *)src),*(undefined4 *)((long)src + lVar2),1);
        auVar12 = vpshufb_avx(auVar12,ZEXT816(0x605050402010100));
        auVar12 = vpmaddubsw_avx(auVar12,auVar6);
        auVar12 = vpaddw_avx(auVar12,auVar11);
        auVar12 = vpsraw_avx(auVar12,2);
        *(long *)(im_block + lVar5 * 2) = auVar12._0_8_;
        src = (uint8_t *)((long)src + lVar3);
        lVar5 = lVar5 + 2;
      } while (h != (int)lVar5);
    }
    else if (w == 4) {
      lVar5 = 0;
      auVar14._8_2_ = 2;
      auVar14._0_8_ = 0x2000200020002;
      auVar14._10_2_ = 2;
      auVar14._12_2_ = 2;
      auVar14._14_2_ = 2;
      do {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *(ulong *)src;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *(ulong *)((long)src + lVar2);
        auVar11 = vpunpcklbw_avx(auVar10,auVar13);
        auVar11 = vpshufb_avx(auVar11,auVar12);
        auVar11 = vpmaddubsw_avx(auVar11,auVar6);
        auVar11 = vpaddw_avx(auVar11,auVar14);
        auVar11 = vpsraw_avx(auVar11,2);
        *(undefined1 (*) [16])(im_block + lVar5 * 4) = auVar11;
        src = (uint8_t *)((long)src + lVar3);
        lVar5 = lVar5 + 2;
      } while (h != (int)lVar5);
    }
    else {
      auVar12._8_2_ = 2;
      auVar12._0_8_ = 0x2000200020002;
      auVar12._10_2_ = 2;
      auVar12._12_2_ = 2;
      auVar12._14_2_ = 2;
      do {
        auVar14 = vpshufb_avx(*(undefined1 (*) [16])src,auVar11);
        auVar10 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar2),auVar11);
        auVar14 = vpmaddubsw_avx(auVar14,auVar6);
        auVar10 = vpmaddubsw_avx(auVar10,auVar6);
        auVar14 = vpaddw_avx(auVar14,auVar12);
        auVar13 = vpsraw_avx(auVar14,2);
        auVar14 = vpaddw_avx(auVar10,auVar12);
        auVar14 = vpsraw_avx(auVar14,2);
        *(undefined1 (*) [16])im_block = auVar13;
        *(undefined1 (*) [16])((long)im_block + 0x10) = auVar14;
        src = *(undefined1 (*) [16])src + lVar3;
        im_block = (int16_t *)((long)im_block + 0x20);
        h = h + -2;
      } while (h != 0);
    }
  }
  else {
    auVar11 = ZEXT416(*(uint *)(filter_params_x->filter_ptr +
                               (ulong)((uint)filter_params_x->taps * (subpel_x_q4 & 0xfU)) + 3));
    auVar7._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar11;
    auVar7._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar11;
    auVar7 = vpsrlw_avx2(auVar7,1);
    local_e0 = (__m256i)vpshufb_avx2(auVar7,_DAT_004c2140);
    if (w == 0x10) {
      pauVar4 = (undefined1 (*) [16])(src + 1);
      local_c0 = local_e0;
      do {
        auVar8._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(pauVar4[-1] + (long)src_stride + 0xf) +
             ZEXT116(1) * *(undefined1 (*) [16])(pauVar4[-1] + 0xf);
        auVar8._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(pauVar4[-1] + (long)src_stride + 0xf);
        auVar9._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar4 + src_stride) + ZEXT116(1) * *pauVar4;
        auVar9._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar4 + src_stride);
        auVar1 = vpunpcklbw_avx2(auVar8,auVar9);
        auVar7 = vpunpckhbw_avx2(auVar8,auVar9);
        local_a0 = (__m256i)vpmaddubsw_avx2(auVar1,(undefined1  [32])local_c0);
        local_80 = vpmaddubsw_avx2(auVar7,(undefined1  [32])local_c0);
        xy_x_round_store_32_avx2(&local_a0,im_block);
        im_block = im_block + 0x20;
        pauVar4 = (undefined1 (*) [16])(*pauVar4 + src_stride * 2);
        h = h + -2;
      } while (h != 0);
    }
    else if (w == 0x20) {
      do {
        xy_x_2tap_32_avx2(src,&local_e0,im_block);
        src = src + src_stride;
        im_block = im_block + 0x20;
        h = h + -1;
      } while (h != 0);
    }
    else if (w == 0x40) {
      do {
        xy_x_2tap_32_avx2(src,&local_e0,im_block);
        xy_x_2tap_32_avx2(src + 0x20,&local_e0,im_block + 0x20);
        src = src + src_stride;
        im_block = im_block + 0x40;
        h = h + -1;
      } while (h != 0);
    }
    else {
      do {
        xy_x_2tap_32_avx2(src,&local_e0,im_block);
        xy_x_2tap_32_avx2(src + 0x20,&local_e0,im_block + 0x20);
        xy_x_2tap_32_avx2(src + 0x40,&local_e0,im_block + 0x40);
        xy_x_2tap_32_avx2(src + 0x60,&local_e0,im_block + 0x60);
        src = src + src_stride;
        im_block = im_block + 0x80;
        h = h + -1;
      } while (h != 0);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_hor_2tap_avx2(
    const uint8_t *const src, const int32_t src_stride, const int32_t w,
    const int32_t h, const InterpFilterParams *const filter_params_x,
    const int32_t subpel_x_q4, int16_t *const im_block) {
  const uint8_t *src_ptr = src;
  int32_t y = h;
  int16_t *im = im_block;

  if (w <= 8) {
    __m128i coeffs_128;

    prepare_half_coeffs_2tap_ssse3(filter_params_x, subpel_x_q4, &coeffs_128);

    if (w == 2) {
      do {
        const __m128i r =
            x_convolve_2tap_2x2_sse4_1(src_ptr, src_stride, &coeffs_128);
        xy_x_round_store_2x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 2;
        y -= 2;
      } while (y);
    } else if (w == 4) {
      do {
        const __m128i r =
            x_convolve_2tap_4x2_ssse3(src_ptr, src_stride, &coeffs_128);
        xy_x_round_store_4x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 4;
        y -= 2;
      } while (y);
    } else {
      assert(w == 8);

      do {
        __m128i r[2];

        x_convolve_2tap_8x2_ssse3(src_ptr, src_stride, &coeffs_128, r);
        xy_x_round_store_8x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 8;
        y -= 2;
      } while (y);
    }
  } else {
    __m256i coeffs_256;

    prepare_half_coeffs_2tap_avx2(filter_params_x, subpel_x_q4, &coeffs_256);

    if (w == 16) {
      do {
        __m256i r[2];

        x_convolve_2tap_16x2_avx2(src_ptr, src_stride, &coeffs_256, r);
        xy_x_round_store_32_avx2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 16;
        y -= 2;
      } while (y);
    } else if (w == 32) {
      do {
        xy_x_2tap_32_avx2(src_ptr, &coeffs_256, im);
        src_ptr += src_stride;
        im += 32;
      } while (--y);
    } else if (w == 64) {
      do {
        xy_x_2tap_32_avx2(src_ptr + 0 * 32, &coeffs_256, im + 0 * 32);
        xy_x_2tap_32_avx2(src_ptr + 1 * 32, &coeffs_256, im + 1 * 32);
        src_ptr += src_stride;
        im += 64;
      } while (--y);
    } else {
      assert(w == 128);

      do {
        xy_x_2tap_32_avx2(src_ptr + 0 * 32, &coeffs_256, im + 0 * 32);
        xy_x_2tap_32_avx2(src_ptr + 1 * 32, &coeffs_256, im + 1 * 32);
        xy_x_2tap_32_avx2(src_ptr + 2 * 32, &coeffs_256, im + 2 * 32);
        xy_x_2tap_32_avx2(src_ptr + 3 * 32, &coeffs_256, im + 3 * 32);
        src_ptr += src_stride;
        im += 128;
      } while (--y);
    }
  }
}